

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::StartMouseMovingWindow(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  FocusWindow(window);
  SetActiveID(window->MoveId,window);
  pIVar4->NavDisableHighlight = true;
  IVar1 = (pIVar4->IO).MouseClickedPos[0];
  IVar2 = window->RootWindow->Pos;
  IVar3.y = IVar1.y - IVar2.y;
  IVar3.x = IVar1.x - IVar2.x;
  pIVar4->ActiveIdClickOffset = IVar3;
  pIVar4->ActiveIdNoClearOnFocusLoss = true;
  pIVar5 = GImGui;
  (GImGui->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
  (pIVar5->ActiveIdUsingKeyInputMask).Storage[2] = 0xffffffff;
  (pIVar5->ActiveIdUsingKeyInputMask).Storage[3] = 0xffffffff;
  (pIVar5->ActiveIdUsingKeyInputMask).Storage[4] = 0xffffffff;
  pIVar5->ActiveIdUsingNavDirMask = 0xffffffff;
  pIVar5->ActiveIdUsingNavInputMask = 0xffffffff;
  (pIVar5->ActiveIdUsingKeyInputMask).Storage[0] = 0xffffffff;
  (pIVar5->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
  pIVar5->NavMoveSubmitted = false;
  pIVar5->NavMoveScoringItems = false;
  pIVar5->NavAnyRequest = pIVar5->NavInitRequest;
  if (((window->Flags & 4) == 0) && ((window->RootWindow->Flags & 4) == 0)) {
    pIVar4->MovingWindow = window;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is not permitted to move.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - window->RootWindow->Pos;
    g.ActiveIdNoClearOnFocusLoss = true;
    SetActiveIdUsingNavAndKeys();

    bool can_move_window = true;
    if ((window->Flags & ImGuiWindowFlags_NoMove) || (window->RootWindow->Flags & ImGuiWindowFlags_NoMove))
        can_move_window = false;
    if (can_move_window)
        g.MovingWindow = window;
}